

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_inspect(uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uchar uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  
  uVar8 = 0x30;
  if ((in != (uchar *)0x0 && insize != 0) && (uVar8 = 0x1b, 0x20 < insize)) {
    lodepng_info_cleanup(&state->info_png);
    (state->info_png).color.colortype = LCT_RGBA;
    (state->info_png).color.bitdepth = 8;
    auVar12 = ZEXT1632(ZEXT816(0) << 0x40);
    (state->info_png).color.palette = (uchar *)auVar12._0_8_;
    (state->info_png).color.palettesize = auVar12._8_8_;
    (state->info_png).color.key_defined = auVar12._16_4_;
    (state->info_png).color.key_r = auVar12._20_4_;
    (state->info_png).color.key_g = auVar12._24_4_;
    (state->info_png).color.key_b = auVar12._28_4_;
    (state->info_png).interlace_method = 0;
    (state->info_png).compression_method = 0;
    (state->info_png).filter_method = 0;
    (state->info_png).phys_defined = 0;
    (state->info_png).unknown_chunks_data[0] = (uchar *)auVar12._0_8_;
    (state->info_png).unknown_chunks_data[1] = (uchar *)auVar12._8_8_;
    (state->info_png).unknown_chunks_data[2] = (uchar *)auVar12._16_8_;
    (state->info_png).unknown_chunks_size[0] = auVar12._24_8_;
    *(undefined1 (*) [32])((state->info_png).unknown_chunks_data + 2) = ZEXT1632(ZEXT816(0) << 0x40)
    ;
    auVar13 = ZEXT464(0) << 0x40;
    uVar8 = 0x1c;
    (state->info_png).background_defined = auVar13._0_4_;
    (state->info_png).background_r = auVar13._4_4_;
    (state->info_png).background_g = auVar13._8_4_;
    (state->info_png).background_b = auVar13._12_4_;
    (state->info_png).text_num = auVar13._16_8_;
    (state->info_png).text_keys = (char **)auVar13._24_8_;
    (state->info_png).text_strings = (char **)auVar13._32_8_;
    (state->info_png).itext_num = auVar13._40_8_;
    (state->info_png).itext_keys = (char **)auVar13._48_8_;
    (state->info_png).itext_langtags = (char **)auVar13._56_8_;
    *(undefined1 (*) [64])((long)&(state->info_png).text_num + 4) = auVar13;
    if ((((*in == 0x89) && (((in[1] == 'P' && (in[2] == 'N')) && (in[3] == 'G')))) &&
        (((in[4] == '\r' && (in[5] == '\n')) && (in[6] == '\x1a')))) && (in[7] == '\n')) {
      iVar9 = swap_bytes(*(undefined4 *)(in + 8));
      uVar8 = 0x5e;
      if (iVar9 == 0xd) {
        uVar7 = lodepng_chunk_type_equals(in + 8,"IHDR");
        if (uVar7 == '\0') {
          uVar8 = 0x1d;
        }
        else {
          uVar8 = swap_bytes(*(undefined4 *)(in + 0x10));
          *w = uVar8;
          uVar8 = swap_bytes(*(undefined4 *)(in + 0x14));
          *h = uVar8;
          uVar8 = 0x5d;
          bVar2 = in[0x18];
          (state->info_png).color.bitdepth = (uint)bVar2;
          bVar3 = in[0x19];
          (state->info_png).color.colortype = (uint)bVar3;
          bVar4 = in[0x1a];
          (state->info_png).compression_method = (uint)bVar4;
          bVar5 = in[0x1b];
          (state->info_png).filter_method = (uint)bVar5;
          bVar6 = in[0x1c];
          (state->info_png).interlace_method = (uint)bVar6;
          if ((*w != 0) && (*h != 0)) {
            if ((state->decoder).ignore_crc == 0) {
              uVar10 = 0xffffffff;
              lVar11 = 0xc;
              do {
                pbVar1 = in + lVar11;
                lVar11 = lVar11 + 1;
                uVar10 = uVar10 >> 8 ^ lodepng_crc32_table[(byte)(*pbVar1 ^ (byte)uVar10)];
              } while (lVar11 != 0x1d);
              uVar8 = 0x39;
              if ((uVar10 ^ ((uint)in[0x1e] << 0x10 | (uint)in[0x1d] << 0x18 | (uint)in[0x1f] << 8 |
                            (uint)in[0x20])) != 0xffffffff) goto LAB_0038274e;
            }
            uVar8 = 0x20;
            if (((bVar4 == 0) && (uVar8 = 0x21, bVar5 == 0)) && (uVar8 = 0x22, bVar6 < 2)) {
              uVar8 = checkColorValidity((uint)bVar3,(uint)bVar2);
            }
          }
        }
      }
    }
  }
LAB_0038274e:
  state->error = uVar8;
  return uVar8;
}

Assistant:

unsigned lodepng_inspect(unsigned* w, unsigned* h, LodePNGState* state,
                         const unsigned char* in, size_t insize)
{
  LodePNGInfo* info = &state->info_png;
  if(insize == 0 || in == 0)
  {
    CERROR_RETURN_ERROR(state->error, 48); /*error: the given data is empty*/
  }
  if(insize < 33)
  {
    CERROR_RETURN_ERROR(state->error, 27); /*error: the data length is smaller than the length of a PNG header*/
  }

  /*when decoding a new PNG image, make sure all parameters created after previous decoding are reset*/
  lodepng_info_cleanup(info);
  lodepng_info_init(info);

  if(in[0] != 137 || in[1] != 80 || in[2] != 78 || in[3] != 71
     || in[4] != 13 || in[5] != 10 || in[6] != 26 || in[7] != 10)
  {
    CERROR_RETURN_ERROR(state->error, 28); /*error: the first 8 bytes are not the correct PNG signature*/
  }
  if(lodepng_chunk_length(in + 8) != 13)
  {
    CERROR_RETURN_ERROR(state->error, 94); /*error: header size must be 13 bytes*/
  }
  if(!lodepng_chunk_type_equals(in + 8, "IHDR"))
  {
    CERROR_RETURN_ERROR(state->error, 29); /*error: it doesn't start with a IHDR chunk!*/
  }

  /*read the values given in the header*/
  *w = lodepng_read32bitInt(&in[16]);
  *h = lodepng_read32bitInt(&in[20]);
  info->color.bitdepth = in[24];
  info->color.colortype = (LodePNGColorType)in[25];
  info->compression_method = in[26];
  info->filter_method = in[27];
  info->interlace_method = in[28];

  if(*w == 0 || *h == 0)
  {
    CERROR_RETURN_ERROR(state->error, 93);
  }

  if(!state->decoder.ignore_crc)
  {
    unsigned CRC = lodepng_read32bitInt(&in[29]);
    unsigned checksum = lodepng_crc32(&in[12], 17);
    if(CRC != checksum)
    {
      CERROR_RETURN_ERROR(state->error, 57); /*invalid CRC*/
    }
  }

  /*error: only compression method 0 is allowed in the specification*/
  if(info->compression_method != 0) CERROR_RETURN_ERROR(state->error, 32);
  /*error: only filter method 0 is allowed in the specification*/
  if(info->filter_method != 0) CERROR_RETURN_ERROR(state->error, 33);
  /*error: only interlace methods 0 and 1 exist in the specification*/
  if(info->interlace_method > 1) CERROR_RETURN_ERROR(state->error, 34);

  state->error = checkColorValidity(info->color.colortype, info->color.bitdepth);
  return state->error;
}